

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsMousePosValid(ImVec2 *mouse_pos)

{
  bool local_21;
  ImVec2 *local_20;
  ImVec2 p;
  float MOUSE_INVALID;
  ImVec2 *mouse_pos_local;
  
  local_20 = mouse_pos;
  if (mouse_pos == (ImVec2 *)0x0) {
    local_20 = &(GImGui->IO).MousePos;
  }
  p.x = (*local_20).x;
  local_21 = false;
  if (-256000.0 <= p.x) {
    p.y = (*local_20).y;
    local_21 = -256000.0 <= p.y;
  }
  return local_21;
}

Assistant:

bool ImGui::IsMousePosValid(const ImVec2* mouse_pos)
{
    // The assert is only to silence a false-positive in XCode Static Analysis.
    // Because GImGui is not dereferenced in every code path, the static analyzer assume that it may be NULL (which it doesn't for other functions).
    IM_ASSERT(GImGui != NULL);
    const float MOUSE_INVALID = -256000.0f;
    ImVec2 p = mouse_pos ? *mouse_pos : GImGui->IO.MousePos;
    return p.x >= MOUSE_INVALID && p.y >= MOUSE_INVALID;
}